

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NGramStorageTest.cpp
# Opt level: O1

void __thiscall
ngram_storage_check_iterator_check_Test::~ngram_storage_check_iterator_check_Test
          (ngram_storage_check_iterator_check_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(ngram_storage_check, iterator_check) {
    vector<pair<vector<uint32_t>, uint32_t>> ngrams;
    unordered_set<vector<uint32_t>, IntegerVectorHasher> source_ngrams;
    for (int i = 0; i < 10000; i++) {
        vector<uint32_t> ngram;
        for (int j = 0; j < 3; j++)
            ngram.push_back(uint32_t(prng() % 26));
        ngrams.push_back(make_pair(ngram, prng() % 10 + 1));
        source_ngrams.insert(ngram);
    }

    int i = 0;
    NGramStorage storage(ngrams);
    unordered_set<vector<uint32_t>, IntegerVectorHasher> target_ngrams;
    for (auto it = storage.begin(3); it != storage.end(3); it++) {
        target_ngrams.insert(it->first);
        i++;
    }

    ASSERT_TRUE(source_ngrams == target_ngrams);
}